

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.h
# Opt level: O2

void __thiscall
mp::
AbsConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertCtxNeg(AbsConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ItemType_conflict1 *ac,int param_2)

{
  int iVar1;
  int iVar2;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *pFVar3;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<double> __l_01;
  initializer_list<int> __l_02;
  allocator_type local_2a2;
  allocator_type local_2a1;
  _Vector_base<int,_std::allocator<int>_> local_2a0;
  _Vector_base<double,_std::allocator<double>_> local_288;
  int local_270;
  int local_26c;
  double local_268 [3];
  LinTerms local_250;
  LinTerms local_1d8;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_160;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_c0;
  
  iVar1 = (ac->super_FunctionalConstraint).result_var_;
  iVar2 = (ac->super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId>).
          args_._M_elems[0];
  pFVar3 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            *)(this->
              super_BasicFuncConstrCvt<mp::AbsConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ).
              super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              .mdl_cvt_;
  local_268[0] = 1.0;
  local_268[1] = 1.0;
  __l._M_len = 2;
  __l._M_array = local_268;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_288,__l,&local_2a1);
  __l_00._M_len = 2;
  __l_00._M_array = &local_270;
  local_270 = iVar1;
  local_26c = iVar2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2a0,__l_00,&local_2a2);
  LinTerms::LinTerms(&local_1d8,(vector<double,_std::allocator<double>_> *)&local_288,
                     (vector<int,_std::allocator<int>_> *)&local_2a0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (&local_c0,&local_1d8,(AlgConRhs<1>)0x0,true);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>(pFVar3,&local_c0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint(&local_c0);
  LinTerms::~LinTerms(&local_1d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2a0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_288);
  pFVar3 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            *)(this->
              super_BasicFuncConstrCvt<mp::AbsConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ).
              super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              .mdl_cvt_;
  local_268[0] = 1.0;
  local_268[1] = -1.0;
  __l_01._M_len = 2;
  __l_01._M_array = local_268;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_288,__l_01,&local_2a1);
  __l_02._M_len = 2;
  __l_02._M_array = &local_270;
  local_270 = iVar1;
  local_26c = iVar2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2a0,__l_02,&local_2a2);
  LinTerms::LinTerms(&local_250,(vector<double,_std::allocator<double>_> *)&local_288,
                     (vector<int,_std::allocator<int>_> *)&local_2a0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (&local_160,&local_250,(AlgConRhs<1>)0x0,true);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>(pFVar3,&local_160);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint(&local_160);
  LinTerms::~LinTerms(&local_250);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2a0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_288);
  return;
}

Assistant:

void ConvertCtxNeg(const ItemType& ac, int ) {
    const int arg = ac.GetArguments()[0];
    const int res = ac.GetResultVar();
    GetMC().AddConstraint(LinConGE({{1.0, 1.0}, {res, arg}}, {0.0}));
    GetMC().AddConstraint(LinConGE({{1.0, -1.0}, {res, arg}}, {0.0}));
  }